

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool anon_unknown.dwarf_11b465a::cmRt2CtSelector<std::greater,_std::greater_equal,_std::equal_to>::
     eval<int>(int r,int lhs,int rhs)

{
  greater<int> local_19;
  int local_18;
  int local_14;
  int rhs_local;
  int lhs_local;
  int r_local;
  
  if (r == 0) {
    lhs_local._3_1_ = false;
  }
  else {
    local_18 = rhs;
    local_14 = lhs;
    rhs_local = r;
    if (r == 1) {
      lhs_local._3_1_ = std::greater<int>::operator()(&local_19,&local_14,&local_18);
    }
    else {
      lhs_local._3_1_ =
           cmRt2CtSelector<std::greater_equal,_std::equal_to>::eval<int>(r + -1,lhs,rhs);
    }
  }
  return lhs_local._3_1_;
}

Assistant:

static bool eval(int r, T lhs, T rhs)
  {
    switch (r) {
      case 0:
        return false;
      case 1:
        return Comp<T>()(lhs, rhs);
      default:
        return cmRt2CtSelector<Ops...>::eval(r - 1, lhs, rhs);
    }
  }